

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

shared_ptr<ccs::CcsTracer> __thiscall
ccs::CcsTracer::makeLoggingTracer
          (CcsTracer *this,shared_ptr<ccs::CcsLogger> *logger,bool logAccesses)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ccs::CcsTracer> sVar1;
  shared_ptr<ccs::(anonymous_namespace)::LoggingTracer> local_30;
  undefined1 local_19;
  shared_ptr<ccs::CcsLogger> *psStack_18;
  bool logAccesses_local;
  shared_ptr<ccs::CcsLogger> *logger_local;
  
  local_19 = logAccesses;
  psStack_18 = logger;
  logger_local = (shared_ptr<ccs::CcsLogger> *)this;
  std::make_shared<ccs::(anonymous_namespace)::LoggingTracer,std::shared_ptr<ccs::CcsLogger>,bool&>
            ((shared_ptr<ccs::CcsLogger> *)&local_30,(bool *)logger);
  std::shared_ptr<ccs::CcsTracer>::shared_ptr<ccs::(anonymous_namespace)::LoggingTracer,void>
            ((shared_ptr<ccs::CcsTracer> *)this,&local_30);
  std::shared_ptr<ccs::(anonymous_namespace)::LoggingTracer>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<ccs::CcsTracer>)
         sVar1.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CcsTracer> CcsTracer::makeLoggingTracer(
  std::shared_ptr<CcsLogger> logger, bool logAccesses) {
  return std::make_shared<LoggingTracer>(std::move(logger), logAccesses);
}